

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

void whitespace_handler(void *data,char *s,int len)

{
  int iVar1;
  parser_info *info;
  int len_local;
  char *s_local;
  void *data_local;
  
  if ((*(int *)((long)data + 0x50) < 1) && (iVar1 = is_whitespace(s,len), iVar1 == 0)) {
    coda_set_error(-400,"non-whitespace character data not allowed here");
    abort_parser((parser_info *)data);
  }
  return;
}

Assistant:

static void XMLCALL whitespace_handler(void *data, const char *s, int len)
{
    parser_info *info = (parser_info *)data;

    if (info->unparsed_depth > 0)
    {
        return;
    }

    /* the generic char handler only allows white space (which is ignored) */
    if (!is_whitespace(s, len))
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "non-whitespace character data not allowed here");
        abort_parser(info);
    }
}